

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void AMPLS__internal__Close(AMPLS_MP_Solver *slv)

{
  long *plVar1;
  void *pvVar2;
  pointer *__ptr;
  
  plVar1 = (long *)slv->internal_info_;
  if (plVar1 != (long *)0x0) {
    if ((long *)plVar1[0x13] != plVar1 + 0x15) {
      operator_delete((long *)plVar1[0x13],plVar1[0x15] + 1);
    }
    pvVar2 = (void *)plVar1[0x10];
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,plVar1[0x12] - (long)pvVar2);
    }
    std::vector<AMPLSOption,_std::allocator<AMPLSOption>_>::~vector
              ((vector<AMPLSOption,_std::allocator<AMPLSOption>_> *)(plVar1 + 0xd));
    pvVar2 = (void *)plVar1[10];
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,plVar1[0xc] - (long)pvVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(plVar1 + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(plVar1 + 4));
    if ((long *)*plVar1 != (long *)0x0) {
      (**(code **)(*(long *)*plVar1 + 8))();
    }
    *plVar1 = 0;
    operator_delete(plVar1,0xb8);
  }
  operator_delete(slv,0x18);
  return;
}

Assistant:

void AMPLS__internal__Close(AMPLS_MP_Solver* slv) {
  assert(slv->internal_info_);
  delete (AMPLS_MP__internal*)slv->internal_info_;
  delete slv;
}